

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlDumpAttributeDecl(xmlBufferPtr buf,xmlAttributePtr attr)

{
  uint uVar1;
  xmlAttributePtr attr_local;
  xmlBufferPtr buf_local;
  
  if ((buf != (xmlBufferPtr)0x0) && (attr != (xmlAttributePtr)0x0)) {
    xmlBufferWriteChar(buf,"<!ATTLIST ");
    xmlBufferWriteCHAR(buf,attr->elem);
    xmlBufferWriteChar(buf," ");
    if (attr->prefix != (xmlChar *)0x0) {
      xmlBufferWriteCHAR(buf,attr->prefix);
      xmlBufferWriteChar(buf,":");
    }
    xmlBufferWriteCHAR(buf,attr->name);
    uVar1 = attr->atype - XML_ATTRIBUTE_CDATA;
    if (uVar1 < 9 || attr->atype == XML_ATTRIBUTE_NOTATION) {
      switch((long)&switchD_001d13eb::switchdataD_00275554 +
             (long)(int)(&switchD_001d13eb::switchdataD_00275554)[uVar1]) {
      case 0x1d13ed:
        xmlBufferWriteChar(buf," CDATA");
        break;
      case 0x1d1402:
        xmlBufferWriteChar(buf," ID");
        break;
      case 0x1d1417:
        xmlBufferWriteChar(buf," IDREF");
        break;
      case 0x1d142c:
        xmlBufferWriteChar(buf," IDREFS");
        break;
      case 0x1d1441:
        xmlBufferWriteChar(buf," ENTITY");
        break;
      case 0x1d1456:
        xmlBufferWriteChar(buf," ENTITIES");
        break;
      case 0x1d146b:
        xmlBufferWriteChar(buf," NMTOKEN");
        break;
      case 0x1d147d:
        xmlBufferWriteChar(buf," NMTOKENS");
        break;
      case 0x1d148f:
        xmlBufferWriteChar(buf," (");
        xmlDumpEnumeration(buf,attr->tree);
        break;
      case 0x1d14b2:
        xmlBufferWriteChar(buf," NOTATION (");
        xmlDumpEnumeration(buf,attr->tree);
      }
    }
    else {
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                  "Internal: ATTRIBUTE struct corrupted invalid type\n",(char *)0x0);
    }
    uVar1 = attr->def - XML_ATTRIBUTE_NONE;
    if (uVar1 < 3 || attr->def == XML_ATTRIBUTE_FIXED) {
      switch((long)&switchD_001d1513::switchdataD_0027557c +
             (long)(int)(&switchD_001d1513::switchdataD_0027557c)[uVar1]) {
      case 0x1d1515:
        break;
      case 0x1d1517:
        xmlBufferWriteChar(buf," #REQUIRED");
        break;
      case 0x1d1529:
        xmlBufferWriteChar(buf," #IMPLIED");
        break;
      case 0x1d153b:
        xmlBufferWriteChar(buf," #FIXED");
      }
    }
    else {
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                  "Internal: ATTRIBUTE struct corrupted invalid def\n",(char *)0x0);
    }
    if (attr->defaultValue != (xmlChar *)0x0) {
      xmlBufferWriteChar(buf," ");
      xmlBufferWriteQuotedString(buf,attr->defaultValue);
    }
    xmlBufferWriteChar(buf,">\n");
  }
  return;
}

Assistant:

void
xmlDumpAttributeDecl(xmlBufferPtr buf, xmlAttributePtr attr) {
    if ((buf == NULL) || (attr == NULL))
        return;
    xmlBufferWriteChar(buf, "<!ATTLIST ");
    xmlBufferWriteCHAR(buf, attr->elem);
    xmlBufferWriteChar(buf, " ");
    if (attr->prefix != NULL) {
	xmlBufferWriteCHAR(buf, attr->prefix);
	xmlBufferWriteChar(buf, ":");
    }
    xmlBufferWriteCHAR(buf, attr->name);
    switch (attr->atype) {
	case XML_ATTRIBUTE_CDATA:
	    xmlBufferWriteChar(buf, " CDATA");
	    break;
	case XML_ATTRIBUTE_ID:
	    xmlBufferWriteChar(buf, " ID");
	    break;
	case XML_ATTRIBUTE_IDREF:
	    xmlBufferWriteChar(buf, " IDREF");
	    break;
	case XML_ATTRIBUTE_IDREFS:
	    xmlBufferWriteChar(buf, " IDREFS");
	    break;
	case XML_ATTRIBUTE_ENTITY:
	    xmlBufferWriteChar(buf, " ENTITY");
	    break;
	case XML_ATTRIBUTE_ENTITIES:
	    xmlBufferWriteChar(buf, " ENTITIES");
	    break;
	case XML_ATTRIBUTE_NMTOKEN:
	    xmlBufferWriteChar(buf, " NMTOKEN");
	    break;
	case XML_ATTRIBUTE_NMTOKENS:
	    xmlBufferWriteChar(buf, " NMTOKENS");
	    break;
	case XML_ATTRIBUTE_ENUMERATION:
	    xmlBufferWriteChar(buf, " (");
	    xmlDumpEnumeration(buf, attr->tree);
	    break;
	case XML_ATTRIBUTE_NOTATION:
	    xmlBufferWriteChar(buf, " NOTATION (");
	    xmlDumpEnumeration(buf, attr->tree);
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ATTRIBUTE struct corrupted invalid type\n",
		    NULL);
    }
    switch (attr->def) {
	case XML_ATTRIBUTE_NONE:
	    break;
	case XML_ATTRIBUTE_REQUIRED:
	    xmlBufferWriteChar(buf, " #REQUIRED");
	    break;
	case XML_ATTRIBUTE_IMPLIED:
	    xmlBufferWriteChar(buf, " #IMPLIED");
	    break;
	case XML_ATTRIBUTE_FIXED:
	    xmlBufferWriteChar(buf, " #FIXED");
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ATTRIBUTE struct corrupted invalid def\n",
		    NULL);
    }
    if (attr->defaultValue != NULL) {
	xmlBufferWriteChar(buf, " ");
	xmlBufferWriteQuotedString(buf, attr->defaultValue);
    }
    xmlBufferWriteChar(buf, ">\n");
}